

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AS_02_JXS.cpp
# Opt level: O0

void __thiscall
AS_02::JXS::MXFReader::MXFReader(MXFReader *this,IFileReaderFactory *fileReaderFactory)

{
  h__Reader *this_00;
  Dictionary *d;
  IFileReaderFactory *fileReaderFactory_local;
  MXFReader *this_local;
  
  this->_vptr_MXFReader = (_func_int **)&PTR__MXFReader_001ef380;
  ASDCP::mem_ptr<AS_02::JXS::MXFReader::h__Reader>::mem_ptr(&this->m_Reader);
  this_00 = (h__Reader *)operator_new(0x500);
  d = (Dictionary *)ASDCP::DefaultSMPTEDict();
  h__Reader::h__Reader(this_00,d,fileReaderFactory);
  ASDCP::mem_ptr<AS_02::JXS::MXFReader::h__Reader>::operator=(&this->m_Reader,this_00);
  return;
}

Assistant:

AS_02::JXS::MXFReader::MXFReader(const Kumu::IFileReaderFactory& fileReaderFactory)
{
  m_Reader = new h__Reader(&DefaultSMPTEDict(), fileReaderFactory);
}